

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

void testutil_random_fe_test(secp256k1_fe *x)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uchar bin [32];
  uchar auStack_58 [40];
  
  do {
    testrand_bytes_test(auStack_58,0x20);
    secp256k1_fe_impl_set_b32_mod(x,auStack_58);
    bVar2 = (x->n[2] & x->n[3] & x->n[1]) == 0xfffffffffffff;
    bVar3 = x->n[4] == 0xffffffffffff;
    bVar1 = 0xffffefffffc2e < x->n[0];
    if (bVar1 && (bVar2 && bVar3)) {
      x->magnitude = -1;
    }
    else {
      x->magnitude = 1;
      x->normalized = 1;
      secp256k1_fe_verify(x);
    }
  } while (bVar1 && (bVar2 && bVar3));
  return;
}

Assistant:

static void testutil_random_fe_test(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        testrand256_test(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}